

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::pipeline::anon_unknown_0::AlphaToCoverageTest::createMultisampleTestInstance
          (AlphaToCoverageTest *this,Context *context,VkPrimitiveTopology topology,
          vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *vertices,
          VkPipelineMultisampleStateCreateInfo *multisampleStateParams,
          VkPipelineColorBlendAttachmentState *colorBlendState)

{
  AlphaToCoverageInstance *this_00;
  VkPipelineColorBlendAttachmentState *colorBlendState_local;
  VkPipelineMultisampleStateCreateInfo *multisampleStateParams_local;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *vertices_local;
  VkPrimitiveTopology topology_local;
  Context *context_local;
  AlphaToCoverageTest *this_local;
  
  this_00 = (AlphaToCoverageInstance *)operator_new(0x90);
  AlphaToCoverageInstance::AlphaToCoverageInstance
            (this_00,context,topology,vertices,multisampleStateParams,colorBlendState,
             this->m_geometryType);
  return &this_00->super_TestInstance;
}

Assistant:

TestInstance* AlphaToCoverageTest::createMultisampleTestInstance (Context&										context,
																  VkPrimitiveTopology							topology,
																  const std::vector<Vertex4RGBA>&				vertices,
																  const VkPipelineMultisampleStateCreateInfo&	multisampleStateParams,
																  const VkPipelineColorBlendAttachmentState&	colorBlendState) const
{
	return new AlphaToCoverageInstance(context, topology, vertices, multisampleStateParams, colorBlendState, m_geometryType);
}